

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::get_download_queue
          (torrent *this,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          *queue)

{
  uint uVar1;
  pointer ppVar2;
  pointer pbVar3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  element_type *p;
  span<const_libtorrent::aux::piece_picker::downloading_piece> q_00;
  int block_size;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  q;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *this_01;
  
  ppVar2 = (queue->
           super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((queue->
      super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (queue->
    super__Vector_base<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  block_size = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x41])();
  this_01 = (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
            CONCAT44(extraout_var,block_size);
  pbVar3 = (this_01->
           super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((this_01->super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3) {
    (this_01->super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>).
    _M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  if ((0 < (((this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length) &&
     (this_00._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
     this_00._M_head_impl != (piece_picker *)0x0)) {
    piece_picker::get_download_queue(&q,this_00._M_head_impl);
    if (q.
        super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        q.
        super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar4 = piece_picker::blocks_in_piece
                        ((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                         ,(piece_index_t)0x0);
      ::std::vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>::resize
                (this_01,(long)iVar4 *
                         (((long)q.
                                 super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)q.
                                super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xc));
      p = (this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = *(uint *)&(((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           *)&(p->m_files).m_piece_length)->
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0x4000;
      if (uVar1 < 0x4000) {
        uVar5 = uVar1;
      }
      if ((int)uVar1 < 1) {
        uVar5 = 0x4000;
      }
      q_00.m_len = (difference_type)
                   q.
                   super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      q_00.m_ptr = (downloading_piece *)queue;
      anon_unknown_135::initialize_piece_info
                ((anon_unknown_135 *)this_00._M_head_impl,(piece_picker *)p,
                 (torrent_info *)(ulong)uVar5,block_size,
                 (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
                 q.
                 super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                 ._M_impl.super__Vector_impl_data._M_start,q_00,
                 (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
                  *)(((long)q.
                            super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)q.
                           super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc));
    }
    ::std::
    _Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
    ::~_Vector_base(&q.
                     super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                   );
  }
  return;
}

Assistant:

void torrent::get_download_queue(std::vector<partial_piece_info>* queue) const
	{
		TORRENT_ASSERT(is_single_thread());
		queue->clear();
		std::vector<block_info>& blk = m_ses.block_info_storage();
		blk.clear();

		if (!valid_metadata() || !has_picker()) return;
		piece_picker const& p = picker();
		std::vector<piece_picker::downloading_piece> q
			= p.get_download_queue();
		if (q.empty()) return;

		const int blocks_per_piece = m_picker->blocks_in_piece(piece_index_t(0));
		blk.resize(q.size() * aux::numeric_cast<std::size_t>(blocks_per_piece));

		initialize_piece_info(p, torrent_file(), block_size(), blk, q, queue);
	}